

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O2

void __thiscall
TLeonardoHeap<smoothsort_ptr<int>_>::insertion_sort
          (TLeonardoHeap<smoothsort_ptr<int>_> *this,size_t element)

{
  ulong uVar1;
  uint uVar2;
  size_t order;
  
  uVar1 = this->tree_vector;
  if ((~(uint)uVar1 & 3) == 0) {
    this->tree_vector = uVar1 >> 2 | 1;
    uVar2 = *(int *)&this->first_tree + 2;
    this->first_tree = (unsigned_short)uVar2;
    order = (size_t)(uVar2 & 0xffff);
  }
  else if (this->first_tree == 1) {
    this->tree_vector = uVar1 * 2 + 1;
    this->first_tree = 0;
    order = 0;
  }
  else {
    this->tree_vector = uVar1 << ((char)this->first_tree - 1U & 0x3f) | 1;
    this->first_tree = 1;
    order = 1;
  }
  filter(this,element,order,true);
  return;
}

Assistant:

inline void TLeonardoHeap<T>::insertion_sort(size_t element) {
	if((tree_vector & 1) && (tree_vector & 2)) {	// Smallest two trees are of sequential order
		// Insert a tree of order L_{k+2} with the new element as the root
		tree_vector = (tree_vector >> 2) | 1;
		first_tree += 2;
	} else if(first_tree == 1) {
		// Insert a singleton node of order L_0
		tree_vector = (tree_vector << 1) | 1;
		first_tree = 0;
	} else {
		// Insert a singleton node of order L_1
		tree_vector = (tree_vector << (first_tree-1)) | 1;
		first_tree = 1;
	}
	// Filter leftwards to restore ascending root and max-heap properties
	filter(element, first_tree);
}